

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

char * mjs::string_value(value_type t)

{
  wostream *this;
  wostringstream _woss;
  wstring_view local_198;
  wostringstream local_188 [376];
  
  if (t < (reference|null)) {
    return &DAT_001a0c40 + *(int *)(&DAT_001a0c40 + (ulong)t * 4);
  }
  std::__cxx11::wostringstream::wostringstream(local_188);
  this = std::operator<<((wostream *)local_188,"Not implemented: ");
  std::wostream::operator<<((wostream *)this,t);
  std::__cxx11::wstringbuf::str();
  throw_runtime_error(&local_198,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                      ,0x1e);
}

Assistant:

const char* string_value(value_type t) {
    switch (t) {
    case value_type::undefined: return "undefined";
    case value_type::null:      return "null";
    case value_type::boolean:   return "boolean";
    case value_type::number:    return "number";
    case value_type::string:    return "string";
    case value_type::object:    return "object";
    case value_type::reference: return "reference";
    }
    NOT_IMPLEMENTED((int)t);
}